

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2-template-128.h
# Opt level: O0

void next_addresses(block *address_block,block *input_block)

{
  long in_RSI;
  __m256i zero2_block [32];
  __m256i zero_block [32];
  undefined1 auStackY_840 [1024];
  undefined1 local_440 [476];
  int in_stack_fffffffffffffd9c;
  block *in_stack_fffffffffffffda0;
  block *in_stack_fffffffffffffda8;
  __m256i *in_stack_fffffffffffffdb0;
  
  memset(local_440,0,0x400);
  memset(auStackY_840,0,0x400);
  *(long *)(in_RSI + 0x30) = *(long *)(in_RSI + 0x30) + 1;
  fill_block(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
             in_stack_fffffffffffffd9c);
  fill_block(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
             in_stack_fffffffffffffd9c);
  return;
}

Assistant:

static void next_addresses(block *address_block, block *input_block)
{
    /*Temporary zero-initialized blocks*/
    __m128i zero_block[ARGON2_OWORDS_IN_BLOCK];
    __m128i zero2_block[ARGON2_OWORDS_IN_BLOCK];

    memset(zero_block, 0, sizeof(zero_block));
    memset(zero2_block, 0, sizeof(zero2_block));

    /*Increasing index counter*/
    input_block->v[6]++;

    /*First iteration of G*/
    fill_block(zero_block, input_block, address_block, 0);

    /*Second iteration of G*/
    fill_block(zero2_block, address_block, address_block, 0);
}